

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_OpenGL_1.c
# Opt level: O0

GPU_Renderer * GPU_CreateRenderer_OpenGL_1(GPU_RendererID request)

{
  GPU_RendererImpl *pGVar1;
  char *in_stack_00000008;
  GPU_Renderer *renderer;
  
  renderer = (GPU_Renderer *)SDL_malloc(0x68);
  if (renderer == (GPU_Renderer *)0x0) {
    renderer = (GPU_Renderer *)0x0;
  }
  else {
    memset(renderer,0,0x68);
    (renderer->id).name = in_stack_00000008;
    *(char **)&(renderer->id).renderer = request.name;
    (renderer->id).minor_version = request.renderer;
    *(int *)&(renderer->id).field_0x14 = request.major_version;
    (renderer->id).renderer = 2;
    renderer->shader_language = GPU_LANGUAGE_GLSL;
    renderer->min_shader_version = 0x6e;
    renderer->max_shader_version = 0x6e;
    renderer->default_image_anchor_x = 0.5;
    renderer->default_image_anchor_y = 0.5;
    renderer->current_context_target = (GPU_Target *)0x0;
    pGVar1 = (GPU_RendererImpl *)SDL_malloc(0x310);
    renderer->impl = pGVar1;
    memset(renderer->impl,0,0x310);
    renderer->impl->Init = Init;
    renderer->impl->CreateTargetFromWindow = CreateTargetFromWindow;
    renderer->impl->CreateAliasTarget = CreateAliasTarget;
    renderer->impl->MakeCurrent = MakeCurrent;
    renderer->impl->SetAsCurrent = SetAsCurrent;
    renderer->impl->ResetRendererState = ResetRendererState;
    renderer->impl->AddDepthBuffer = AddDepthBuffer;
    renderer->impl->SetWindowResolution = SetWindowResolution;
    renderer->impl->SetVirtualResolution = SetVirtualResolution;
    renderer->impl->UnsetVirtualResolution = UnsetVirtualResolution;
    renderer->impl->Quit = Quit;
    renderer->impl->SetFullscreen = SetFullscreen;
    renderer->impl->SetCamera = SetCamera;
    renderer->impl->CreateImage = CreateImage;
    renderer->impl->CreateImageUsingTexture = CreateImageUsingTexture;
    renderer->impl->CreateAliasImage = CreateAliasImage;
    renderer->impl->SaveImage = SaveImage;
    renderer->impl->CopyImage = CopyImage;
    renderer->impl->UpdateImage = UpdateImage;
    renderer->impl->UpdateImageBytes = UpdateImageBytes;
    renderer->impl->ReplaceImage = ReplaceImage;
    renderer->impl->CopyImageFromSurface = CopyImageFromSurface;
    renderer->impl->CopyImageFromTarget = CopyImageFromTarget;
    renderer->impl->CopySurfaceFromTarget = CopySurfaceFromTarget;
    renderer->impl->CopySurfaceFromImage = CopySurfaceFromImage;
    renderer->impl->FreeImage = FreeImage;
    renderer->impl->GetTarget = GetTarget;
    renderer->impl->FreeTarget = FreeTarget;
    renderer->impl->Blit = Blit;
    renderer->impl->BlitRotate = BlitRotate;
    renderer->impl->BlitScale = BlitScale;
    renderer->impl->BlitTransform = BlitTransform;
    renderer->impl->BlitTransformX = BlitTransformX;
    renderer->impl->PrimitiveBatchV = PrimitiveBatchV;
    renderer->impl->GenerateMipmaps = GenerateMipmaps;
    renderer->impl->SetClip = SetClip;
    renderer->impl->UnsetClip = UnsetClip;
    renderer->impl->GetPixel = GetPixel;
    renderer->impl->SetImageFilter = SetImageFilter;
    renderer->impl->SetWrapMode = SetWrapMode;
    renderer->impl->GetTextureHandle = GetTextureHandle;
    renderer->impl->ClearRGBA = ClearRGBA;
    renderer->impl->FlushBlitBuffer = FlushBlitBuffer;
    renderer->impl->Flip = Flip;
    renderer->impl->CompileShader_RW = CompileShader_RW;
    renderer->impl->CompileShader = CompileShader;
    renderer->impl->CreateShaderProgram = CreateShaderProgram;
    renderer->impl->LinkShaderProgram = LinkShaderProgram;
    renderer->impl->FreeShader = FreeShader;
    renderer->impl->FreeShaderProgram = FreeShaderProgram;
    renderer->impl->AttachShader = AttachShader;
    renderer->impl->DetachShader = DetachShader;
    renderer->impl->ActivateShaderProgram = ActivateShaderProgram;
    renderer->impl->DeactivateShaderProgram = DeactivateShaderProgram;
    renderer->impl->GetShaderMessage = GetShaderMessage;
    renderer->impl->GetAttributeLocation = GetAttributeLocation;
    renderer->impl->GetUniformLocation = GetUniformLocation;
    renderer->impl->LoadShaderBlock = LoadShaderBlock;
    renderer->impl->SetShaderImage = SetShaderImage;
    renderer->impl->GetUniformiv = GetUniformiv;
    renderer->impl->SetUniformi = SetUniformi;
    renderer->impl->SetUniformiv = SetUniformiv;
    renderer->impl->GetUniformuiv = GetUniformuiv;
    renderer->impl->SetUniformui = SetUniformui;
    renderer->impl->SetUniformuiv = SetUniformuiv;
    renderer->impl->GetUniformfv = GetUniformfv;
    renderer->impl->SetUniformf = SetUniformf;
    renderer->impl->SetUniformfv = SetUniformfv;
    renderer->impl->SetUniformMatrixfv = SetUniformMatrixfv;
    renderer->impl->SetAttributef = SetAttributef;
    renderer->impl->SetAttributei = SetAttributei;
    renderer->impl->SetAttributeui = SetAttributeui;
    renderer->impl->SetAttributefv = SetAttributefv;
    renderer->impl->SetAttributeiv = SetAttributeiv;
    renderer->impl->SetAttributeuiv = SetAttributeuiv;
    renderer->impl->SetAttributeSource = SetAttributeSource;
    renderer->impl->SetLineThickness = SetLineThickness;
    renderer->impl->GetLineThickness = GetLineThickness;
    renderer->impl->Pixel = Pixel;
    renderer->impl->Line = Line;
    renderer->impl->Arc = Arc;
    renderer->impl->ArcFilled = ArcFilled;
    renderer->impl->Circle = Circle;
    renderer->impl->CircleFilled = CircleFilled;
    renderer->impl->Ellipse = Ellipse;
    renderer->impl->EllipseFilled = EllipseFilled;
    renderer->impl->Sector = Sector;
    renderer->impl->SectorFilled = SectorFilled;
    renderer->impl->Tri = Tri;
    renderer->impl->TriFilled = TriFilled;
    renderer->impl->Rectangle = Rectangle;
    renderer->impl->RectangleFilled = RectangleFilled;
    renderer->impl->RectangleRound = RectangleRound;
    renderer->impl->RectangleRoundFilled = RectangleRoundFilled;
    renderer->impl->Polygon = Polygon;
    renderer->impl->Polyline = Polyline;
    renderer->impl->PolygonFilled = PolygonFilled;
  }
  return renderer;
}

Assistant:

GPU_Renderer* GPU_CreateRenderer_OpenGL_1(GPU_RendererID request)
{
    GPU_Renderer* renderer = (GPU_Renderer*)SDL_malloc(sizeof(GPU_Renderer));
    if(renderer == NULL)
        return NULL;

    memset(renderer, 0, sizeof(GPU_Renderer));

    renderer->id = request;
    renderer->id.renderer = GPU_RENDERER_OPENGL_1;
    renderer->shader_language = GPU_LANGUAGE_GLSL;
    renderer->min_shader_version = 110;
    renderer->max_shader_version = SDL_GPU_GLSL_VERSION;
    
    renderer->default_image_anchor_x = 0.5f;
    renderer->default_image_anchor_y = 0.5f;
    
    renderer->current_context_target = NULL;
    
    renderer->impl = (GPU_RendererImpl*)SDL_malloc(sizeof(GPU_RendererImpl));
    memset(renderer->impl, 0, sizeof(GPU_RendererImpl));
    SET_COMMON_FUNCTIONS(renderer->impl);

    return renderer;
}